

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,std::default_delete<signed_char>>*,std::vector<std::unique_ptr<signed_char,std::default_delete<signed_char>>,std::allocator<std::unique_ptr<signed_char,std::default_delete<signed_char>>>>>,boost::use_default,boost::use_default,boost::use_default,boost::use_default>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
          *lhs,char *op,initializer_list<int> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  initializer_list<int> *local_28;
  initializer_list<int> *rhs_local;
  char *op_local;
  iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
  *lhs_local;
  
  local_28 = (initializer_list<int> *)op;
  rhs_local = (initializer_list<int> *)lhs;
  op_local = (char *)this;
  lhs_local = (iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
               *)__return_storage_ptr__;
  toString<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>,_true>
            (&local_58,
             (iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
              *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::initializer_list<int>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }